

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O0

void ed_add_pc(ed *out,ed *P,pced *Q)

{
  limb_t *in_RSI;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t e;
  fld_t d;
  fld_t c;
  fld_t b;
  fld_t a;
  limb_t alStackY_198 [6];
  limb_t local_168 [6];
  limb_t local_138 [6];
  limb_t local_108 [6];
  limb_t local_d8 [6];
  limb_t local_a8;
  limb_t *in_stack_ffffffffffffff60;
  limb_t *in_stack_ffffffffffffff68;
  limb_t *in_stack_ffffffffffffff70;
  limb_t local_78 [6];
  limb_t local_48 [7];
  limb_t *local_10;
  
  local_10 = in_RSI;
  fld_sub(local_48,in_RSI + 5,in_RSI);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  fld_add(local_78,local_10 + 5,local_10);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  fld_scale2(local_d8,local_10 + 0xf);
  fld_sub(local_108,local_78,local_48);
  fld_sub(local_138,local_d8,&local_a8);
  fld_add(local_168,local_d8,&local_a8);
  fld_add(alStackY_198,local_78,local_48);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  fld_mul(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  return;
}

Assistant:

static void
ed_add_pc(struct ed *out, const struct ed *P, const struct pced *Q)
{
	fld_t a, b, c, d, e, f, g, h;

	fld_sub(a, P->y, P->x);
	fld_mul(a, a, Q->diff);

	fld_add(b, P->y, P->x);
	fld_mul(b, b, Q->sum);

	fld_mul(c, P->t, Q->prod);
	fld_scale2(d, P->z);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}